

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.h
# Opt level: O0

void __thiscall
wallet::feebumper::SignatureWeights::AddSigWeight
          (SignatureWeights *this,size_t weight,SigVersion sigversion)

{
  long lVar1;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    *(long *)(in_RDI + 2) = in_RSI * 4 + *(long *)(in_RDI + 2);
    *in_RDI = *in_RDI + 4;
  }
  else if (in_EDX == 1) {
    *(long *)(in_RDI + 2) = in_RSI + *(long *)(in_RDI + 2);
    *in_RDI = *in_RDI + 1;
  }
  else if (in_EDX - 2U < 2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/feebumper.h"
                  ,0x5f,
                  "void wallet::feebumper::SignatureWeights::AddSigWeight(const size_t, const SigVersion)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddSigWeight(const size_t weight, const SigVersion sigversion)
    {
        switch (sigversion) {
        case SigVersion::BASE:
            m_sigs_weight += weight * WITNESS_SCALE_FACTOR;
            m_sigs_count += 1 * WITNESS_SCALE_FACTOR;
            break;
        case SigVersion::WITNESS_V0:
            m_sigs_weight += weight;
            m_sigs_count++;
            break;
        case SigVersion::TAPROOT:
        case SigVersion::TAPSCRIPT:
            assert(false);
        }
    }